

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O0

ssize_t __thiscall QVncClientCursor::write(QVncClientCursor *this,int __fd,void *__buf,size_t __n)

{
  uint16_t uVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  QTcpSocket *pQVar6;
  ulong uVar7;
  QVncServer *this_00;
  QVncScreen *pQVar8;
  void *pvVar9;
  undefined8 uVar10;
  longlong lVar11;
  undefined4 in_register_00000034;
  QVncClient *this_01;
  long in_FS_OFFSET;
  int i_1;
  int width;
  int i;
  char *buffer;
  int depth;
  int n;
  QTcpSocket *socket;
  QImage bitmap;
  QImage img;
  qint32 encoding;
  quint16 tmp [6];
  ImageConversionFlag in_stack_fffffffffffffefc;
  QFlags<Qt::ImageConversionFlag> *in_stack_ffffffffffffff00;
  QTcpSocket *pQVar12;
  undefined4 in_stack_ffffffffffffff08;
  Format in_stack_ffffffffffffff0c;
  QImage *pQVar13;
  undefined8 in_stack_ffffffffffffff18;
  QFlagsStorage<Qt::ImageConversionFlag> QVar14;
  void *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  int local_a4;
  int local_9c;
  QImage local_68 [24];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined8 local_14;
  undefined4 local_c;
  long local_8;
  
  QVar14.i = (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  this_01 = (QVncClient *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QVncClient::clientSocket(this_01);
  local_14 = 0xaaaaaaaaaaaaaaaa;
  local_c = 0xaaaaaaaa;
  uVar1 = htons(0);
  local_14 = CONCAT62(local_14._2_6_,uVar1);
  uVar1 = htons(1);
  local_14._0_4_ = CONCAT22(uVar1,(undefined2)local_14);
  iVar2 = QPoint::x((QPoint *)0x10dc59);
  uVar1 = htons((uint16_t)iVar2);
  local_14._0_6_ = CONCAT24(uVar1,(undefined4)local_14);
  iVar2 = QPoint::y((QPoint *)0x10dc77);
  uVar1 = htons((uint16_t)iVar2);
  local_14 = CONCAT26(uVar1,(undefined6)local_14);
  uVar1 = QImage::width();
  uVar1 = htons(uVar1);
  local_c = CONCAT22(local_c._2_2_,uVar1);
  uVar1 = QImage::height();
  uVar1 = htons(uVar1);
  local_c = CONCAT22(uVar1,(undefined2)local_c);
  QIODevice::write((char *)pQVar6,(longlong)&local_14);
  local_18 = 0x11ffffff;
  QIODevice::write((char *)pQVar6,(longlong)&local_18);
  uVar7 = QImage::isNull();
  if ((uVar7 & 1) == 0) {
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    pQVar13 = &this->cursor;
    this_00 = QVncClient::server(this_01);
    pQVar8 = QVncServer::screen(this_00);
    uVar3 = (**(code **)(*(long *)&pQVar8->super_QFbScreen + 0x78))();
    QFlags<Qt::ImageConversionFlag>::QFlags(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    QImage::convertToFormat
              ((QImage *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (Format)((ulong)in_stack_ffffffffffffff00 >> 0x20),(ImageConversionFlags)QVar14.i);
    iVar2 = QVncClient::clientBytesPerPixel(this_01);
    iVar4 = QImage::width();
    iVar4 = iVar2 * iVar4;
    QImage::depth();
    pvVar9 = operator_new__((long)iVar4);
    local_9c = 0;
    while( true ) {
      QVar14.i = (Int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      iVar4 = local_9c;
      iVar5 = QImage::height();
      if (iVar5 <= iVar4) break;
      in_stack_ffffffffffffff28 = pvVar9;
      uVar10 = QImage::scanLine((int)&local_30);
      QImage::width();
      QVncClient::convertPixels
                ((QVncClient *)CONCAT44(iVar2,uVar3),(char *)pQVar13,
                 (char *)CONCAT44(iVar4,in_stack_ffffffffffffff38),(int)((ulong)uVar10 >> 0x20),
                 (int)uVar10);
      QIODevice::write((char *)pQVar6,(longlong)pvVar9);
      local_9c = local_9c + 1;
    }
    if (pvVar9 != (void *)0x0) {
      operator_delete__(pvVar9);
    }
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    pQVar13 = &this->cursor;
    QFlags<Qt::ImageConversionFlag>::QFlags(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    QImage::createAlphaMask((QFlags_conflict *)local_68);
    QFlags<Qt::ImageConversionFlag>::QFlags(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    QImage::convertToFormat(pQVar13,in_stack_ffffffffffffff0c,(ImageConversionFlags)QVar14.i);
    QImage::~QImage(local_68);
    QImage::width();
    local_a4 = 0;
    while (iVar2 = local_a4, iVar4 = QImage::height(), iVar2 < iVar4) {
      pQVar12 = pQVar6;
      lVar11 = QImage::scanLine((int)&local_50);
      QIODevice::write((char *)pQVar12,lVar11);
      local_a4 = local_a4 + 1;
    }
    QImage::~QImage((QImage *)&local_50);
    QImage::~QImage((QImage *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QVncClientCursor::write(QVncClient *client) const
{
    QTcpSocket *socket = client->clientSocket();

    // FramebufferUpdate header
    {
        const quint16 tmp[6] = { htons(0),
                                 htons(1),
                                 htons(static_cast<uint16_t>(hotspot.x())), htons(static_cast<uint16_t>(hotspot.y())),
                                 htons(static_cast<uint16_t>(cursor.width())),
                                 htons(static_cast<uint16_t>(cursor.height())) };
        socket->write(reinterpret_cast<const char*>(tmp), sizeof(tmp));

        const qint32 encoding = qToBigEndian(-239);
        socket->write(reinterpret_cast<const char*>(&encoding), sizeof(encoding));
    }

    if (cursor.isNull())
        return;

    // write pixels
    Q_ASSERT(cursor.hasAlphaChannel());
    const QImage img = cursor.convertToFormat(client->server()->screen()->format());
    const int n = client->clientBytesPerPixel() * img.width();
    const int depth = img.depth();
    char *buffer = new char[n];
    for (int i = 0; i < img.height(); ++i) {
        client->convertPixels(buffer, (const char*)img.scanLine(i), img.width(), depth);
        socket->write(buffer, n);
    }
    delete[] buffer;

    // write mask
    const QImage bitmap = cursor.createAlphaMask().convertToFormat(QImage::Format_Mono);
    Q_ASSERT(bitmap.depth() == 1);
    Q_ASSERT(bitmap.size() == img.size());
    const int width = (bitmap.width() + 7) / 8;
    for (int i = 0; i < bitmap.height(); ++i)
        socket->write(reinterpret_cast<const char*>(bitmap.scanLine(i)), width);
}